

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int header_get_priority(HEADER_HANDLE header,uint8_t *priority_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  undefined8 in_RAX;
  AMQP_VALUE value;
  uint32_t item_count;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  if (header == (HEADER_HANDLE)0x0) {
    return 0x3a20;
  }
  iVar1 = amqpvalue_get_composite_item_count(header->composite_value,&local_14);
  if (iVar1 != 0) {
    return 0x3a28;
  }
  if (((1 < local_14) &&
      (value = amqpvalue_get_composite_item_in_place(header->composite_value,1),
      value != (AMQP_VALUE)0x0)) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)) {
    iVar1 = amqpvalue_get_ubyte(value,priority_value);
    if (iVar1 == 0) {
      return 0;
    }
    AVar2 = amqpvalue_get_type(value);
    if (AVar2 != AMQP_TYPE_NULL) {
      return 0x3a41;
    }
  }
  *priority_value = '\x04';
  return 0;
}

Assistant:

int header_get_priority(HEADER_HANDLE header, uint8_t* priority_value)
{
    int result;

    if (header == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)header;
        if (amqpvalue_get_composite_item_count(header_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 1)
            {
                *priority_value = 4;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(header_instance->composite_value, 1);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *priority_value = 4;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_ubyte(item_value, priority_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *priority_value = 4;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}